

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_lock_door(loc_conflict grid)

{
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  int iStack_1c;
  _Bool more;
  wchar_t power;
  wchar_t j;
  wchar_t i;
  loc_conflict grid_local;
  
  grid_local.x._3_1_ = false;
  _Var1 = do_cmd_disarm_test(player,grid);
  if (_Var1) {
    power = (player->state).skills[0];
    if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
      power = power / 10;
    }
    if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
      power = power / 10;
    }
    iVar2 = m_bonus(7,(int)player->depth);
    iStack_1c = power - iVar2;
    if (iStack_1c < 2) {
      iStack_1c = 2;
    }
    uVar3 = Rand_div(100);
    if ((int)uVar3 < iStack_1c) {
      msg("You lock the door.");
      square_set_door_lock((chunk_conflict2 *)cave,grid,(int)iVar2);
    }
    else if ((power < L'\x06') || (uVar3 = Rand_div(power), (int)(uVar3 + 1) < 6)) {
      msg("You failed to lock the door.");
    }
    else {
      event_signal(EVENT_INPUT_FLUSH);
      msg("You failed to lock the door.");
      grid_local.x._3_1_ = true;
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_lock_door(struct loc grid)
{
	int i, j, power;
	bool more = false;

	/* Verify legality */
	if (!do_cmd_disarm_test(player, grid)) return false;

	/* Get the "disarm" factor */
	i = player->state.skills[SKILL_DISARM_PHYS];

	/* Penalize some conditions */
	if (player->timed[TMD_BLIND] || no_light(player))
		i = i / 10;
	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE])
		i = i / 10;

	/* Calculate lock "power" */
	power = m_bonus(7, player->depth);

	/* Extract the difficulty */
	j = i - power;

	/* Always have a small chance of success */
	if (j < 2) j = 2;

	/* Success */
	if (randint0(100) < j) {
		msg("You lock the door.");
		square_set_door_lock(cave, grid, power);
	}

	/* Failure -- Keep trying */
	else if ((i > 5) && (randint1(i) > 5)) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to lock the door.");

		/* We may keep trying */
		more = true;
	}
	/* Failure */
	else
		msg("You failed to lock the door.");

	/* Result */
	return more;
}